

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

hittable_list * final_scene(void)

{
  vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_> *pvVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this;
  int iVar2;
  int iVar3;
  int iVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  hittable_list *in_RDI;
  int iVar6;
  vec3 local_298;
  hittable_list boxes2;
  shared_ptr<lambertian> emat;
  shared_ptr<dielectric> local_248;
  sphere *local_238;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_230;
  undefined1 local_221;
  vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_> *local_220;
  shared_ptr<noise_texture> pertext;
  shared_ptr<lambertian> white;
  shared_ptr<rotate_y> local_1f8;
  vec3 local_1e8;
  hittable_list *local_1d0;
  int local_1c4;
  int ny;
  int nx;
  vec3 local_1b8;
  shared_ptr<bvh_node> local_198;
  value_type local_188;
  shared_ptr<lambertian> moving_sphere_material;
  shared_ptr<lambertian> ground;
  value_type local_158;
  value_type local_148;
  double local_130;
  _func_int **local_128;
  shared_ptr<diffuse_light> light;
  int local_110;
  int nn;
  hittable_list boxes1;
  value_type local_e8;
  value_type local_d8;
  value_type local_c8;
  value_type local_b8;
  value_type local_a8;
  value_type local_98;
  value_type local_88;
  value_type local_78;
  value_type local_68;
  value_type local_58;
  double local_40;
  double local_38;
  
  boxes1.super_hittable._vptr_hittable = (_func_int **)&PTR_hit_0012e0f0;
  boxes1.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  boxes1.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  boxes1.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1d0 = in_RDI;
  boxes2.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)operator_new(0x30);
  ((boxes2.objects.
    super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
    _M_impl.super__Vector_impl_data._M_start)->
  super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x100000001;
  ((boxes2.objects.
    super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
    _M_impl.super__Vector_impl_data._M_start)->
  super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)&PTR___Sp_counted_ptr_inplace_0012e630;
  boxes2.super_hittable._vptr_hittable =
       (_func_int **)
       (boxes2.objects.
        super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
        _M_impl.super__Vector_impl_data._M_start + 1);
  boxes2.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start[1].super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3fdeb851eb851eb8;
  boxes2.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start[2].super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x3fea8f5c28f5c28f;
  boxes2.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start[2].super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3fe0f5c28f5c28f6;
  boxes2.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start[1].super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)&PTR_value_0012e680;
  ground.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<lambertian,std::allocator<lambertian>,std::shared_ptr<constant_texture>>
            (&ground.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (lambertian **)&ground,(allocator<lambertian> *)&local_1b8,
             (shared_ptr<constant_texture> *)&boxes2);
  if (boxes2.objects.
      super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               boxes2.objects.
               super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
  }
  iVar2 = 0;
  do {
    local_128 = (_func_int **)((double)iVar2 * 100.0 + -1000.0);
    local_130 = (double)local_128 + 100.0;
    iVar6 = 0;
    local_1c4 = iVar2;
    do {
      local_220 = (vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_> *)
                  ((double)iVar6 * 100.0 + -1000.0);
      iVar2 = rand();
      local_1b8.e[1] = (double)iVar2 * 4.656612873077393e-10 * 100.0 + 1.0;
      boxes2.super_hittable._vptr_hittable = local_128;
      boxes2.objects.
      super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      boxes2.objects.
      super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)local_220;
      local_1b8.e[2] = (double)local_220 + 100.0;
      local_1b8.e[0] = local_130;
      local_1e8.e[0] = 0.0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<box,std::allocator<box>,vec3,vec3,std::shared_ptr<lambertian>&>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1e8.e + 1),(box **)&local_1e8,
                 (allocator<box> *)&local_298,(vec3 *)&boxes2,&local_1b8,&ground);
      local_148.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_1e8.e[0];
      local_148.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8.e[1];
      local_1e8.e[0] = 0.0;
      local_1e8.e[1] = 0.0;
      std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::push_back
                (&boxes1.objects,&local_148);
      if (local_148.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_148.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8.e[1] !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8.e[1]);
      }
      iVar6 = iVar6 + 1;
    } while (iVar6 != 0x14);
    iVar2 = local_1c4 + 1;
  } while (iVar2 != 0x14);
  (local_1d0->super_hittable)._vptr_hittable = (_func_int **)&PTR_hit_0012e0f0;
  pvVar1 = &local_1d0->objects;
  (local_1d0->objects).
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (local_1d0->objects).
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_1d0->objects).
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1b8.e[0] = (double)((ulong)local_1b8.e[0] & 0xffffffff00000000);
  local_1e8.e[0] = (double)CONCAT44(local_1e8.e[0]._4_4_,1);
  boxes2.super_hittable._vptr_hittable = (_func_int **)0x0;
  local_220 = pvVar1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<bvh_node,std::allocator<bvh_node>,hittable_list&,int,int>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&boxes2.objects,(bvh_node **)&boxes2,
             (allocator<bvh_node> *)&local_298,&boxes1,(int *)&local_1b8,(int *)&local_1e8);
  local_58.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)boxes2.super_hittable._vptr_hittable;
  local_58.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       boxes2.objects.
       super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  boxes2.super_hittable._vptr_hittable = (_func_int **)0x0;
  boxes2.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::push_back
            (pvVar1,&local_58);
  if (local_58.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (boxes2.objects.
      super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               boxes2.objects.
               super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
  }
  boxes2.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)operator_new(0x30);
  ((boxes2.objects.
    super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
    _M_impl.super__Vector_impl_data._M_start)->
  super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x100000001;
  ((boxes2.objects.
    super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
    _M_impl.super__Vector_impl_data._M_start)->
  super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)&PTR___Sp_counted_ptr_inplace_0012e630;
  boxes2.super_hittable._vptr_hittable =
       (_func_int **)
       (boxes2.objects.
        super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
        _M_impl.super__Vector_impl_data._M_start + 1);
  boxes2.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start[1].super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x401c000000000000;
  boxes2.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start[2].super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x401c000000000000;
  boxes2.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start[2].super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x401c000000000000;
  boxes2.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start[1].super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)&PTR_value_0012e680;
  light.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<diffuse_light,std::allocator<diffuse_light>,std::shared_ptr<constant_texture>>
            (&light.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (diffuse_light **)&light,(allocator<diffuse_light> *)&local_1b8,
             (shared_ptr<constant_texture> *)&boxes2);
  if (boxes2.objects.
      super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               boxes2.objects.
               super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
  }
  local_1b8.e[0] = (double)CONCAT44(local_1b8.e[0]._4_4_,0x7b);
  local_1e8.e[0] = (double)CONCAT44(local_1e8.e[0]._4_4_,0x1a7);
  local_298.e[0] = (double)CONCAT44(local_298.e[0]._4_4_,0x93);
  moving_sphere_material.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       CONCAT44(moving_sphere_material.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr._4_4_,0x19c);
  local_248.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       CONCAT44(local_248.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_,
                0x22a);
  boxes2.super_hittable._vptr_hittable = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<xz_rect,std::allocator<xz_rect>,int,int,int,int,int,std::shared_ptr<diffuse_light>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&boxes2.objects,(xz_rect **)&boxes2,
             (allocator<xz_rect> *)&emat,(int *)&local_1b8,(int *)&local_1e8,(int *)&local_298,
             (int *)&moving_sphere_material,(int *)&local_248,&light);
  local_68.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)boxes2.super_hittable._vptr_hittable;
  local_68.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       boxes2.objects.
       super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  boxes2.super_hittable._vptr_hittable = (_func_int **)0x0;
  boxes2.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::push_back
            (pvVar1,&local_68);
  if (local_68.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (boxes2.objects.
      super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               boxes2.objects.
               super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
  }
  local_1b8.e[0] = 400.0;
  local_1b8.e[1] = 400.0;
  local_1b8.e[2] = 200.0;
  local_1e8.e[0] = 430.0;
  local_1e8.e[1] = 400.0;
  local_1e8.e[2] = 200.0;
  boxes2.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)operator_new(0x30);
  ((boxes2.objects.
    super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
    _M_impl.super__Vector_impl_data._M_start)->
  super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x100000001;
  ((boxes2.objects.
    super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
    _M_impl.super__Vector_impl_data._M_start)->
  super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)&PTR___Sp_counted_ptr_inplace_0012e630;
  boxes2.super_hittable._vptr_hittable =
       (_func_int **)
       (boxes2.objects.
        super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
        _M_impl.super__Vector_impl_data._M_start + 1);
  boxes2.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start[1].super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3fe6666666666666;
  boxes2.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start[2].super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x3fd3333333333333;
  boxes2.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start[2].super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3fb999999999999a;
  boxes2.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start[1].super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)&PTR_value_0012e680;
  moving_sphere_material.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<lambertian,std::allocator<lambertian>,std::shared_ptr<constant_texture>>
            (&moving_sphere_material.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(lambertian **)&moving_sphere_material,(allocator<lambertian> *)&local_298
             ,(shared_ptr<constant_texture> *)&boxes2);
  if (boxes2.objects.
      super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               boxes2.objects.
               super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
  }
  local_298.e[0] = (double)((ulong)local_298.e[0] & 0xffffffff00000000);
  local_248.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       CONCAT44(local_248.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_,1)
  ;
  emat.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       CONCAT44(emat.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_,0x32);
  boxes2.super_hittable._vptr_hittable = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<moving_sphere,std::allocator<moving_sphere>,vec3&,vec3&,int,int,int,std::shared_ptr<lambertian>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&boxes2.objects,(moving_sphere **)&boxes2
             ,(allocator<moving_sphere> *)&pertext,&local_1b8,&local_1e8,(int *)&local_298,
             (int *)&local_248,(int *)&emat,&moving_sphere_material);
  local_78.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)boxes2.super_hittable._vptr_hittable;
  local_78.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       boxes2.objects.
       super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  boxes2.super_hittable._vptr_hittable = (_func_int **)0x0;
  boxes2.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::push_back
            (pvVar1,&local_78);
  if (local_78.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (boxes2.objects.
      super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               boxes2.objects.
               super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
  }
  boxes2.super_hittable._vptr_hittable = (_func_int **)0x4070400000000000;
  boxes2.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x4062c00000000000;
  boxes2.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x4046800000000000;
  emat.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       CONCAT44(emat.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_,0x32);
  local_248.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  (local_248.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_use_count = 1;
  (local_248.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_weak_count = 1;
  (local_248.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0012e918;
  local_248.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_248.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 1);
  local_248.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _vptr__Sp_counted_base = (_func_int **)&PTR_emitted_0012e968;
  local_248.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _M_use_count = 0;
  local_248.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _M_weak_count = 0x3ff80000;
  local_298.e[0] = 0.0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<sphere,std::allocator<sphere>,vec3,int,std::shared_ptr<dielectric>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_298.e + 1),(sphere **)&local_298,
             (allocator<sphere> *)&pertext,(vec3 *)&boxes2,(int *)&emat,&local_248);
  local_88.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_298.e[0];
  local_88.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298.e[1];
  local_298.e[0] = 0.0;
  local_298.e[1] = 0.0;
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::push_back
            (pvVar1,&local_88);
  if (local_88.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298.e[1] !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298.e[1]);
  }
  if (local_248.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_248.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  boxes2.super_hittable._vptr_hittable = (_func_int **)0x0;
  boxes2.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x4062c00000000000;
  boxes2.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x4062200000000000;
  emat.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       CONCAT44(emat.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_,0x32);
  local_248.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
  (local_248.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_use_count = 1;
  (local_248.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_weak_count = 1;
  (local_248.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0012e880;
  local_248.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_248.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 1);
  local_248.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _vptr__Sp_counted_base = (_func_int **)&PTR_emitted_0012e8d0;
  local_248.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _M_use_count = -0x66666666;
  local_248.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _M_weak_count = 0x3fe99999;
  local_248.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
  _vptr__Sp_counted_base = (_func_int **)0x3fe999999999999a;
  local_248.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
  _M_use_count = -0x33333333;
  local_248.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
  _M_weak_count = 0x3feccccc;
  local_248.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[3].
  _vptr__Sp_counted_base = (_func_int **)0x3ff0000000000000;
  local_298.e[0] = 0.0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<sphere,std::allocator<sphere>,vec3,int,std::shared_ptr<metal>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_298.e + 1),(sphere **)&local_298,
             (allocator<sphere> *)&pertext,(vec3 *)&boxes2,(int *)&emat,
             (shared_ptr<metal> *)&local_248);
  local_98.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_298.e[0];
  local_98.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298.e[1];
  local_298.e[0] = 0.0;
  local_298.e[1] = 0.0;
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::push_back
            (local_220,&local_98);
  if (local_98.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298.e[1] !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298.e[1]);
  }
  if (local_248.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_248.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  boxes2.super_hittable._vptr_hittable = (_func_int **)0x4076800000000000;
  boxes2.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x4062c00000000000;
  boxes2.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x4062200000000000;
  emat.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       CONCAT44(emat.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_,0x46);
  local_298.e[1] = (double)operator_new(0x20);
  pvVar1 = local_220;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298.e[1])->_M_use_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298.e[1])->_M_weak_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298.e[1])->_vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_0012e918;
  local_298.e[0] = (double)((long)local_298.e[1] + 0x10);
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_298.e[1] + 0x10))->
  _vptr__Sp_counted_base = (_func_int **)&PTR_emitted_0012e968;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_298.e[1] + 0x10))->_M_use_count = 0;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_298.e[1] + 0x10))->_M_weak_count =
       0x3ff80000;
  local_248.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<sphere,std::allocator<sphere>,vec3,int,std::shared_ptr<dielectric>>
            (&local_248.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (sphere **)&local_248,(allocator<sphere> *)&pertext,(vec3 *)&boxes2,(int *)&emat,
             (shared_ptr<dielectric> *)&local_298);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298.e[1] !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298.e[1]);
  }
  local_188.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_248.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_188.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_248.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_248.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_248.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_248.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_248.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_248.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::push_back
            (pvVar1,&local_188);
  if (local_188.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_188.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  emat.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x3fc999999999999a;
  local_298.e[1] = (double)operator_new(0x30);
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298.e[1])->_M_use_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298.e[1])->_M_weak_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298.e[1])->_vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_0012e630;
  local_298.e[0] = (double)((long)local_298.e[1] + 0x10);
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_298.e[1] + 0x10))->_M_use_count =
       -0x66666666;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_298.e[1] + 0x10))->_M_weak_count =
       0x3fc99999;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_298.e[1] + 0x20))->
  _vptr__Sp_counted_base = (_func_int **)0x3fd999999999999a;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_298.e[1] + 0x20))->_M_use_count =
       -0x33333333;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_298.e[1] + 0x20))->_M_weak_count =
       0x3feccccc;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_298.e[1] + 0x10))->
  _vptr__Sp_counted_base = (_func_int **)&PTR_value_0012e680;
  boxes2.super_hittable._vptr_hittable = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<constant_medium,std::allocator<constant_medium>,std::shared_ptr<sphere>&,double,std::shared_ptr<constant_texture>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&boxes2.objects,
             (constant_medium **)&boxes2,(allocator<constant_medium> *)&pertext,
             (shared_ptr<sphere> *)&local_248,(double *)&emat,
             (shared_ptr<constant_texture> *)&local_298);
  local_a8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)boxes2.super_hittable._vptr_hittable;
  local_a8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       boxes2.objects.
       super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  boxes2.super_hittable._vptr_hittable = (_func_int **)0x0;
  boxes2.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::push_back
            (pvVar1,&local_a8);
  if (local_a8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (boxes2.objects.
      super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               boxes2.objects.
               super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298.e[1] !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298.e[1]);
  }
  boxes2.super_hittable._vptr_hittable = (_func_int **)0x0;
  boxes2.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  boxes2.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  pertext.super___shared_ptr<noise_texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       CONCAT44(pertext.super___shared_ptr<noise_texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_,
                5000);
  emat.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  (emat.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count
       = 1;
  (emat.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_weak_count
       = 1;
  (emat.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0012e918;
  emat.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (emat.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 1);
  emat.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _vptr__Sp_counted_base = (_func_int **)&PTR_emitted_0012e968;
  emat.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1]._M_use_count
       = 0;
  emat.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1]._M_weak_count
       = 0x3ff80000;
  local_298.e[0] = 0.0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<sphere,std::allocator<sphere>,vec3,int,std::shared_ptr<dielectric>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_298.e + 1),(sphere **)&local_298,
             (allocator<sphere> *)&white,(vec3 *)&boxes2,(int *)&pertext,
             (shared_ptr<dielectric> *)&emat);
  this._M_pi = local_248.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
  local_248.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298.e[1];
  local_248.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_298.e[0];
  local_298.e[0] = 0.0;
  local_298.e[1] = 0.0;
  if (this._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this._M_pi);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298.e[1] !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298.e[1]);
    }
  }
  if (emat.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (emat.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  emat.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x3f1a36e2eb1c432d;
  local_298.e[1] = (double)operator_new(0x30);
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298.e[1])->_M_use_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298.e[1])->_M_weak_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298.e[1])->_vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_0012e630;
  local_298.e[0] = (double)((long)local_298.e[1] + 0x10);
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_298.e[1] + 0x10))->_M_use_count = 0;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_298.e[1] + 0x10))->_M_weak_count =
       0x3ff00000;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_298.e[1] + 0x20))->
  _vptr__Sp_counted_base = (_func_int **)0x3ff0000000000000;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_298.e[1] + 0x20))->_M_use_count = 0;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_298.e[1] + 0x20))->_M_weak_count =
       0x3ff00000;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_298.e[1] + 0x10))->
  _vptr__Sp_counted_base = (_func_int **)&PTR_value_0012e680;
  boxes2.super_hittable._vptr_hittable = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<constant_medium,std::allocator<constant_medium>,std::shared_ptr<sphere>&,double,std::shared_ptr<constant_texture>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&boxes2.objects,
             (constant_medium **)&boxes2,(allocator<constant_medium> *)&pertext,
             (shared_ptr<sphere> *)&local_248,(double *)&emat,
             (shared_ptr<constant_texture> *)&local_298);
  local_b8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)boxes2.super_hittable._vptr_hittable;
  local_b8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       boxes2.objects.
       super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  boxes2.super_hittable._vptr_hittable = (_func_int **)0x0;
  boxes2.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::push_back
            (pvVar1,&local_b8);
  if (local_b8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (boxes2.objects.
      super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               boxes2.objects.
               super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298.e[1] !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298.e[1]);
  }
  p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)stbi_load("earthmap.jpg",&nx,&ny,&nn,0);
  boxes2.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)operator_new(0x28);
  ((boxes2.objects.
    super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
    _M_impl.super__Vector_impl_data._M_start)->
  super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x100000001;
  ((boxes2.objects.
    super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
    _M_impl.super__Vector_impl_data._M_start)->
  super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)&PTR___Sp_counted_ptr_inplace_0012ea30;
  boxes2.super_hittable._vptr_hittable =
       (_func_int **)
       (boxes2.objects.
        super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
        _M_impl.super__Vector_impl_data._M_start + 1);
  boxes2.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start[1].super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)&PTR_value_0012ea80;
  boxes2.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start[1].super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var5;
  *(int *)&boxes2.objects.
           super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>
           ._M_impl.super__Vector_impl_data._M_start[2].
           super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr = nx;
  *(int *)((long)&boxes2.objects.
                  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[2].
                  super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4) = ny;
  emat.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<lambertian,std::allocator<lambertian>,std::shared_ptr<image_texture>>
            (&emat.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (lambertian **)&emat,(allocator<lambertian> *)&local_298,
             (shared_ptr<image_texture> *)&boxes2);
  if (boxes2.objects.
      super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               boxes2.objects.
               super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
  }
  boxes2.super_hittable._vptr_hittable = (_func_int **)0x4079000000000000;
  boxes2.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x4069000000000000;
  boxes2.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x4079000000000000;
  pertext.super___shared_ptr<noise_texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       CONCAT44(pertext.super___shared_ptr<noise_texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_,
                100);
  local_298.e[0] = 0.0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<sphere,std::allocator<sphere>,vec3,int,std::shared_ptr<lambertian>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_298.e + 1),(sphere **)&local_298,
             (allocator<sphere> *)&white,(vec3 *)&boxes2,(int *)&pertext,&emat);
  local_c8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_298.e[0];
  local_c8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298.e[1];
  local_298.e[0] = 0.0;
  local_298.e[1] = 0.0;
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::push_back
            (pvVar1,&local_c8);
  if (local_c8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298.e[1] !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298.e[1]);
  }
  boxes2.super_hittable._vptr_hittable = (_func_int **)0x3fb999999999999a;
  pertext.super___shared_ptr<noise_texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<noise_texture,std::allocator<noise_texture>,double>
            (&pertext.super___shared_ptr<noise_texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (noise_texture **)&pertext,(allocator<noise_texture> *)&local_298,(double *)&boxes2);
  boxes2.super_hittable._vptr_hittable = (_func_int **)0x406b800000000000;
  boxes2.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x4071800000000000;
  boxes2.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x4072c00000000000;
  local_238 = (sphere *)CONCAT44(local_238._4_4_,0x50);
  white.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<lambertian,std::allocator<lambertian>,std::shared_ptr<noise_texture>&>
            (&white.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (lambertian **)&white,(allocator<lambertian> *)&local_1f8,&pertext);
  local_298.e[0] = 0.0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<sphere,std::allocator<sphere>,vec3,int,std::shared_ptr<lambertian>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_298.e + 1),(sphere **)&local_298,
             (allocator<sphere> *)&local_1f8,(vec3 *)&boxes2,(int *)&local_238,&white);
  local_d8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_298.e[0];
  local_d8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298.e[1];
  local_298.e[0] = 0.0;
  local_298.e[1] = 0.0;
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::push_back
            (pvVar1,&local_d8);
  if (local_d8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298.e[1] !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298.e[1]);
  }
  if (white.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (white.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  boxes2.super_hittable._vptr_hittable = (_func_int **)&PTR_hit_0012e0f0;
  boxes2.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  boxes2.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  boxes2.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_298.e[1] = (double)operator_new(0x30);
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298.e[1])->_M_use_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298.e[1])->_M_weak_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298.e[1])->_vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_0012e630;
  local_298.e[0] = (double)((long)local_298.e[1] + 0x10);
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_298.e[1] + 0x10))->_M_use_count =
       -0xa3d70a4;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_298.e[1] + 0x10))->_M_weak_count =
       0x3fe75c28;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_298.e[1] + 0x20))->
  _vptr__Sp_counted_base = (_func_int **)0x3fe75c28f5c28f5c;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_298.e[1] + 0x20))->_M_use_count =
       -0xa3d70a4;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_298.e[1] + 0x20))->_M_weak_count =
       0x3fe75c28;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_298.e[1] + 0x10))->
  _vptr__Sp_counted_base = (_func_int **)&PTR_value_0012e680;
  white.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<lambertian,std::allocator<lambertian>,std::shared_ptr<constant_texture>>
            (&white.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (lambertian **)&white,(allocator<lambertian> *)&local_238,
             (shared_ptr<constant_texture> *)&local_298);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298.e[1] !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298.e[1]);
  }
  iVar2 = 1000;
  do {
    iVar6 = rand();
    iVar3 = rand();
    iVar4 = rand();
    local_298.e[2] = (double)iVar4 * 4.656612873077393e-10 * 165.0 + 0.0;
    local_298.e[0] = (double)iVar6 * 4.656612873077393e-10 * 165.0 + 0.0;
    local_298.e[1] = (double)iVar3 * 4.656612873077393e-10 * 165.0 + 0.0;
    local_1f8.super___shared_ptr<rotate_y,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         CONCAT44(local_1f8.super___shared_ptr<rotate_y,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_,10
                 );
    local_238 = (sphere *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<sphere,std::allocator<sphere>,vec3,int,std::shared_ptr<lambertian>&>
              (&_Stack_230,&local_238,(allocator<sphere> *)&local_198,&local_298,(int *)&local_1f8,
               &white);
    local_158.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &local_238->super_hittable;
    local_158.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Stack_230._M_pi;
    local_238 = (sphere *)0x0;
    _Stack_230._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::push_back
              (&boxes2.objects,&local_158);
    if (local_158.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_158.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (_Stack_230._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_230._M_pi);
    }
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  local_38 = 0.0;
  local_40 = 1.0;
  local_198.super___shared_ptr<bvh_node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<bvh_node,std::allocator<bvh_node>,hittable_list&,double,double>
            (&local_198.super___shared_ptr<bvh_node,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (bvh_node **)&local_198,(allocator<bvh_node> *)&local_298,&boxes2,&local_38,&local_40);
  pvVar1 = local_220;
  local_110 = 0xf;
  local_1f8.super___shared_ptr<rotate_y,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<rotate_y,std::allocator<rotate_y>,std::shared_ptr<bvh_node>,int>
            (&local_1f8.super___shared_ptr<rotate_y,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (rotate_y **)&local_1f8,(allocator<rotate_y> *)&local_298,&local_198,&local_110);
  local_298.e[0] = -100.0;
  local_298.e[1] = 270.0;
  local_298.e[2] = 395.0;
  local_238 = (sphere *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<translate,std::allocator<translate>,std::shared_ptr<rotate_y>,vec3>
            (&_Stack_230,(translate **)&local_238,(allocator<translate> *)&local_221,&local_1f8,
             &local_298);
  local_e8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_238->super_hittable;
  local_e8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_230._M_pi;
  local_238 = (sphere *)0x0;
  _Stack_230._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::push_back
            (pvVar1,&local_e8);
  if (local_e8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (_Stack_230._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_230._M_pi);
  }
  if (local_1f8.super___shared_ptr<rotate_y,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1f8.super___shared_ptr<rotate_y,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  if (local_198.super___shared_ptr<bvh_node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_198.super___shared_ptr<bvh_node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  if (white.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (white.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  boxes2.super_hittable._vptr_hittable = (_func_int **)&PTR_hit_0012e0f0;
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::~vector
            (&boxes2.objects);
  if (pertext.super___shared_ptr<noise_texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (pertext.super___shared_ptr<noise_texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (emat.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (emat.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_248.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_248.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (moving_sphere_material.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (moving_sphere_material.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (light.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (light.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              );
  }
  if (ground.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (ground.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  boxes1.super_hittable._vptr_hittable = (_func_int **)&PTR_hit_0012e0f0;
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::~vector
            (&boxes1.objects);
  return local_1d0;
}

Assistant:

hittable_list final_scene() {
    hittable_list boxes1;
    auto ground =
            make_shared<lambertian>(make_shared<constant_texture>(vec3(0.48, 0.83, 0.53)));

    const int boxes_per_side = 20;
    for (int i = 0; i < boxes_per_side; i++) {
        for (int j = 0; j < boxes_per_side; j++) {
            auto w = 100.0;
            auto x0 = -1000.0 + i*w;
            auto z0 = -1000.0 + j*w;
            auto y0 = 0.0;
            auto x1 = x0 + w;
            auto y1 = random_double(1,101);
            auto z1 = z0 + w;

            boxes1.add(make_shared<box>(vec3(x0,y0,z0), vec3(x1,y1,z1), ground));
        }
    }

    hittable_list objects;

    objects.add(make_shared<bvh_node>(boxes1, 0, 1));

    auto light = make_shared<diffuse_light>(make_shared<constant_texture>(vec3(7, 7, 7)));
    objects.add(make_shared<xz_rect>(123, 423, 147, 412, 554, light));

    auto center1 = vec3(400, 400, 200);
    auto center2 = center1 + vec3(30,0,0);
    auto moving_sphere_material =
            make_shared<lambertian>(make_shared<constant_texture>(vec3(0.7, 0.3, 0.1)));
    objects.add(make_shared<moving_sphere>(center1, center2, 0, 1, 50, moving_sphere_material));

    objects.add(make_shared<sphere>(vec3(260, 150, 45), 50, make_shared<dielectric>(1.5)));
    objects.add(make_shared<sphere>(
            vec3(0, 150, 145), 50, make_shared<metal>(vec3(0.8, 0.8, 0.9), 10.0)
    ));

    auto boundary = make_shared<sphere>(vec3(360, 150, 145), 70, make_shared<dielectric>(1.5));
    objects.add(boundary);
    objects.add(make_shared<constant_medium>(
            boundary, 0.2, make_shared<constant_texture>(vec3(0.2, 0.4, 0.9))
    ));
    boundary = make_shared<sphere>(vec3(0, 0, 0), 5000, make_shared<dielectric>(1.5));
    objects.add(make_shared<constant_medium>(
            boundary, .0001, make_shared<constant_texture>(vec3(1,1,1))));

    int nx, ny, nn;
    auto tex_data = stbi_load("earthmap.jpg", &nx, &ny, &nn, 0);
    auto emat = make_shared<lambertian>(make_shared<image_texture>(tex_data, nx, ny));
    objects.add(make_shared<sphere>(vec3(400,200, 400), 100, emat));
    auto pertext = make_shared<noise_texture>(0.1);
    objects.add(make_shared<sphere>(vec3(220,280, 300), 80, make_shared<lambertian>(pertext)));

    hittable_list boxes2;
    auto white = make_shared<lambertian>(make_shared<constant_texture>(vec3(0.73, 0.73, 0.73)));
    int ns = 1000;
    for (int j = 0; j < ns; j++) {
        boxes2.add(make_shared<sphere>(vec3::random(0,165), 10, white));
    }

    objects.add(make_shared<translate>(
            make_shared<rotate_y>(
                    make_shared<bvh_node>(boxes2, 0.0, 1.0), 15),
            vec3(-100,270,395)
                )
    );

    return objects;
}